

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableExpression.hpp
# Opt level: O2

string * Kandinsky::VariableExpression::generateName_abi_cxx11_(void)

{
  int __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  __val = generateName::count;
  generateName::count = generateName::count + 1;
  std::__cxx11::to_string(&local_30,__val);
  std::operator+(&local_50,"x_{",&local_30);
  std::operator+(in_RDI,&local_50,"}");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return in_RDI;
}

Assistant:

static std::string generateName()
        {
            static int count(0);
            return "x_{" + std::to_string(count++) + "}";
        }